

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

void __thiscall
lest::passing::passing(passing *this,location *where_,text *expr_,text *decomposition_,bool zen)

{
  allocator local_f9;
  string local_f8 [38];
  byte local_d2;
  allocator local_d1;
  string local_d0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0 [32];
  location local_90;
  allocator local_51;
  string local_50 [39];
  byte local_29;
  text *ptStack_28;
  bool zen_local;
  text *decomposition__local;
  text *expr__local;
  location *where__local;
  passing *this_local;
  
  local_29 = zen;
  ptStack_28 = decomposition_;
  decomposition__local = expr_;
  expr__local = &where_->file;
  where__local = (location *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,"passed",&local_51);
  location::location(&local_90,where_);
  local_d2 = 0;
  if ((local_29 & 1) == 0) {
    std::operator+((char *)local_d0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)" for ");
  }
  else {
    std::allocator<char>::allocator();
    local_d2 = 1;
    std::__cxx11::string::string(local_d0,"",&local_d1);
  }
  std::operator+(local_b0,expr_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f8,"",&local_f9);
  success::success(&this->super_success,(text *)local_50,&local_90,local_b0,(text *)local_f8);
  std::__cxx11::string::~string(local_f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_f9);
  std::__cxx11::string::~string((string *)local_b0);
  std::__cxx11::string::~string(local_d0);
  if ((local_d2 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_d1);
  }
  location::~location(&local_90);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  *(undefined ***)&(this->super_success).super_message = &PTR__passing_00127ce0;
  return;
}

Assistant:

passing( location where_, text expr_, text decomposition_, bool zen )
    : success( "passed", where_, expr_ + (zen ? "":" for " + decomposition_) ) {}